

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
TypeArgumentSet::TypeArgumentSet
          (TypeArgumentSet *this,InplaceStr name,IntrusiveList<TypeHandle> types)

{
  TypeBase::TypeBase(&this->super_TypeBase,0x1b,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223e48;
  (this->types).head = types.head;
  (this->types).tail = types.tail;
  (this->super_TypeBase).isGeneric = true;
  return;
}

Assistant:

TypeArgumentSet(InplaceStr name, IntrusiveList<TypeHandle> types): TypeBase(myTypeID, name), types(types)
	{
		isGeneric = true;
	}